

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O1

void randomize(int *indices,int count)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  if (1 < count) {
    uVar5 = (ulong)(uint)count;
    do {
      uVar4 = mt_random();
      uVar3 = (ulong)uVar4 % (uVar5 & 0xffffffff);
      if (uVar5 - 1 != uVar3) {
        iVar1 = indices[uVar5 - 1];
        indices[uVar5 - 1] = indices[uVar3];
        indices[uVar3] = iVar1;
      }
      bVar2 = 2 < (long)uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar2);
  }
  return;
}

Assistant:

static void randomize(int *indices, int count)
{
	int i, iswap, temp;

	for (i = count - 1; i > 0; i--) {
	    if ((iswap = rn2(i + 1)) == i) continue;
	    temp = indices[i];
	    indices[i] = indices[iswap];
	    indices[iswap] = temp;
	}
}